

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsact.c
# Opt level: O1

void parminstall(Symbol *n,char *num,char *units,char *limits)

{
  char *pcVar1;
  char buf [8192];
  char acStack_2028 [8192];
  
  previous_subtype = n->subtype;
  previous_str = (n->u).str;
  if (previous_str == (char *)0x0) {
    lappendsym(syminorder,n);
  }
  *(byte *)&n->subtype = (byte)n->subtype | 2;
  sprintf(acStack_2028,"\n%s\n%s\n%s\n",num,units,limits);
  pcVar1 = stralloc(acStack_2028,(char *)0x0);
  (n->u).str = pcVar1;
  return;
}

Assistant:

void parminstall(n, num, units, limits)
	Symbol         *n;
	char           *num, *units, *limits;
{
	char buf[NRN_BUFSIZE];

	previous_subtype = n->subtype;	
	previous_str = n->u.str;
	if (n->u.str == (char *) 0)
		Lappendsym(syminorder, n);
	n->subtype |= PARM;
	Sprintf(buf, "\n%s\n%s\n%s\n", num, units, limits);
	n->u.str = stralloc(buf, (char *) 0);
}